

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

ssize_t dma_read_aligned(nettlp *nt,uintptr_t addr,void *buf,size_t count,size_t mrrs)

{
  bool bVar1;
  ssize_t sVar2;
  ulong uVar3;
  size_t done;
  long lVar4;
  ulong uVar5;
  
  lVar4 = 0;
  while( true ) {
    uVar3 = 0x1000 - (ulong)((uint)addr & 0xfff);
    uVar5 = mrrs;
    if (count < mrrs) {
      uVar5 = count;
    }
    if (uVar3 <= uVar5) {
      uVar5 = uVar3;
    }
    sVar2 = dma_read(nt,addr,(void *)((long)buf + lVar4),uVar5);
    if (sVar2 < 0) break;
    lVar4 = lVar4 + sVar2;
    addr = addr + sVar2;
    uVar5 = count - sVar2;
    bVar1 = (long)count < sVar2;
    count = uVar5;
    if (uVar5 == 0 || bVar1) {
      return sVar2;
    }
  }
  return sVar2;
}

Assistant:

ssize_t
dma_read_aligned(struct nettlp *nt, uintptr_t addr, void *buf,
		 size_t count, size_t mrrs)
{
	uintptr_t dma_addr;
	size_t len, max_len, done;
	ssize_t ret, dma_len;

	done = 0;
	dma_addr = addr;
	dma_len = count;

	do {
		max_len = 0x1000 - (dma_addr & 0xFFF);
		len = dma_len < mrrs ? dma_len : mrrs;
		len = len < max_len ? len : max_len;
		ret = dma_read(nt, dma_addr, buf + done, len);
		if (ret < 0)
			return ret;

		/* for next iteration */
		done += ret;
		dma_addr += ret;
		dma_len -= ret;

	} while (dma_len > 0);

	return ret;
}